

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string.cpp
# Opt level: O3

void __thiscall ON_String::MakeReverse(ON_String *this)

{
  char *string;
  ON_Internal_Empty_aString *pOVar1;
  
  pOVar1 = (ON_Internal_Empty_aString *)(this->m_s + -0xc);
  if (this->m_s == (char *)0x0) {
    pOVar1 = &empty_astring;
  }
  if (0 < (pOVar1->header).string_length) {
    CopyArray(this);
    string = this->m_s;
    pOVar1 = (ON_Internal_Empty_aString *)(string + -0xc);
    if (string == (char *)0x0) {
      pOVar1 = &empty_astring;
    }
    Reverse(string,(pOVar1->header).string_length);
    return;
  }
  return;
}

Assistant:

ON_aStringHeader* ON_String::Header() const
{
  ON_aStringHeader* hdr = (ON_aStringHeader*)m_s;
  if (hdr)
    hdr--;
  else
    hdr = &empty_astring.header;
  return hdr;
}